

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_17(QPDF *pdf,char *arg2)

{
  long lVar1;
  long lVar2;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *this;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  QPDFObjectHandle QVar4;
  allocator<char> local_ba;
  allocator<char> local_b9;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_b8;
  string local_a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  string contents;
  shared_ptr<Buffer> b;
  allocator<char> local_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_48;
  QPDFObjectHandle page_kids;
  undefined1 local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  QPDF::getRoot();
  std::__cxx11::string::string<std::allocator<char>>((string *)&contents,"/Pages",local_58);
  QPDFObjectHandle::getKey(local_a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&b,"/Kids",(allocator<char> *)&local_48);
  QPDFObjectHandle::getKey((string *)&page_kids);
  std::__cxx11::string::~string((string *)&b);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
  std::__cxx11::string::~string((string *)&contents);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
  QPDFObjectHandle::getArrayItem((int)&contents);
  lVar1 = QPDFObjectHandle::getObjGen();
  QPDFObjectHandle::getArrayItem((int)&b);
  lVar2 = QPDFObjectHandle::getObjGen();
  if (lVar1 != lVar2) {
    __assert_fail("page_kids.getArrayItem(0).getObjGen() == page_kids.getArrayItem(1).getObjGen()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x30a,"void test_17(QPDF &, const char *)");
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&b.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&contents._M_string_length);
  this = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)QPDF::getAllPages();
  if ((long)(this->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
            super__Vector_impl_data._M_start != 0x30) {
    __assert_fail("pages.size() == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x30c,"void test_17(QPDF &, const char *)");
  }
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(this,0);
  lVar1 = QPDFObjectHandle::getObjGen();
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(this,1);
  lVar2 = QPDFObjectHandle::getObjGen();
  if (lVar1 == lVar2) {
    __assert_fail("!(pages.at(0).getObjGen() == pages.at(1).getObjGen())",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x30d,"void test_17(QPDF &, const char *)");
  }
  p_Var3 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
           std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(this,0);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_b8,p_Var3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&contents,"/Contents",&local_b9);
  QPDFObjectHandle::getKey(local_a8);
  lVar1 = QPDFObjectHandle::getObjGen();
  p_Var3 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
           std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(this,1);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_48,p_Var3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&b,"/Contents",&local_ba);
  QPDFObjectHandle::getKey((string *)local_58);
  lVar2 = QPDFObjectHandle::getObjGen();
  if (lVar1 == lVar2) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
    std::__cxx11::string::~string((string *)&b);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
    std::__cxx11::string::~string((string *)&contents);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
    p_Var3 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
             std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(this,0);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_28,p_Var3);
    QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28;
    QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pdf;
    QPDF::removePage(QVar4);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
    if ((long)(this->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(this->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
              _M_impl.super__Vector_impl_data._M_start != 0x20) {
      __assert_fail("pages.size() == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x312,"void test_17(QPDF &, const char *)");
    }
    p_Var3 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
             std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(this,0);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_b8,p_Var3);
    std::__cxx11::string::string<std::allocator<char>>((string *)&contents,"/Contents",local_58);
    QPDFObjectHandle::getKey(local_a8);
    QPDFObjectHandle::getStreamData((qpdf_stream_decode_level_e)&b);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
    std::__cxx11::string::~string((string *)&contents);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
    lVar1 = Buffer::getBuffer();
    lVar2 = Buffer::getSize();
    contents._M_dataplus._M_p = (pointer)&contents.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&contents,lVar1,lVar2 + lVar1);
    lVar1 = std::__cxx11::string::find((char *)&contents,0x13cb66);
    if (lVar1 != -1) {
      std::__cxx11::string::~string((string *)&contents);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&b.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&page_kids.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return;
    }
    __assert_fail("contents.find(\"page 0\") != std::string::npos",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x315,"void test_17(QPDF &, const char *)");
  }
  __assert_fail("QPDFObjectHandle(pages.at(0)).getKey(\"/Contents\").getObjGen() == QPDFObjectHandle(pages.at(1)).getKey(\"/Contents\").getObjGen()"
                ,"/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                ,0x310,"void test_17(QPDF &, const char *)");
}

Assistant:

static void
test_17(QPDF& pdf, char const* arg2)
{
    // The input file to this test case has a duplicated page.
    QPDFObjectHandle page_kids = pdf.getRoot().getKey("/Pages").getKey("/Kids");
    assert(page_kids.getArrayItem(0).getObjGen() == page_kids.getArrayItem(1).getObjGen());
    std::vector<QPDFObjectHandle> const& pages = pdf.getAllPages();
    assert(pages.size() == 3);
    assert(!(pages.at(0).getObjGen() == pages.at(1).getObjGen()));
    assert(
        QPDFObjectHandle(pages.at(0)).getKey("/Contents").getObjGen() ==
        QPDFObjectHandle(pages.at(1)).getKey("/Contents").getObjGen());
    pdf.removePage(pages.at(0));
    assert(pages.size() == 2);
    std::shared_ptr<Buffer> b = QPDFObjectHandle(pages.at(0)).getKey("/Contents").getStreamData();
    std::string contents = std::string(reinterpret_cast<char const*>(b->getBuffer()), b->getSize());
    assert(contents.find("page 0") != std::string::npos);
}